

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O1

void do_command(string *cmd_string,bool suppress)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char cVar3;
  int **ppiVar4;
  bool **ppbVar5;
  int **arr;
  int **arr_00;
  pointer pcVar6;
  pointer pMVar7;
  size_type sVar8;
  code cVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  long *plVar14;
  istream *piVar15;
  ostream *poVar16;
  size_type *psVar17;
  size_t __n;
  Move *m;
  _Alloc_hider _Var18;
  Move *m_00;
  char *pcVar19;
  long lVar20;
  size_type sVar21;
  byte *pbVar22;
  int i;
  ulong uVar23;
  bool bVar24;
  int n;
  int s_1;
  string name;
  int p;
  string cm;
  string command;
  string s;
  byte abStack_3a8 [32];
  _Alloc_hider local_388;
  char local_378 [48];
  ios_base local_348 [400];
  stringstream line;
  byte abStack_198 [96];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&line,(string *)cmd_string,_S_out|_S_in);
  command._M_dataplus._M_p = (pointer)&command.field_2;
  command._M_string_length = 0;
  command.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&line,(string *)&command);
  iVar10 = std::__cxx11::string::compare((char *)&command);
  if (iVar10 == 0) {
    game_loop();
    goto LAB_0010b47e;
  }
  iVar10 = std::__cxx11::string::compare((char *)&command);
  if (iVar10 == 0) {
    find_moves();
    if (moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      if (!suppress) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No moves",8);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
    }
    else {
      sort_moves(true);
      pMVar7 = moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data
               ._M_start;
      place_move(moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_start,false);
      if (!suppress) {
        print_board();
        operator<<((ostream *)&std::cout,pMVar7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
    }
    goto LAB_0010b47e;
  }
  iVar10 = std::__cxx11::string::compare((char *)&command);
  if (iVar10 == 0) {
    name._M_string_length = 0;
    name.field_2._M_allocated_capacity = name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    paVar1 = &cm.field_2;
    cm._M_string_length = 0;
    cm.field_2._M_local_buf[0] = '\0';
    name._M_dataplus._M_p = (pointer)&name.field_2;
    cm._M_dataplus._M_p = (pointer)paVar1;
    piVar15 = std::operator>>((istream *)&line,(string *)&name);
    if ((((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) == 0) &&
       ((iVar10 = std::__cxx11::string::compare((char *)&name), iVar10 != 0 ||
        (piVar15 = std::operator>>((istream *)&line,(string *)&name),
        ((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) == 0)))) {
      plVar14 = (long *)std::istream::operator>>((istream *)&line,&n);
      if (((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) ||
         (plVar14 = (long *)std::istream::operator>>((istream *)&line,&s_1),
         (*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0)) {
        n = (bsize - (bsize + 1 >> 0x1f)) + 1 >> 1;
        s_1 = n;
      }
      piVar15 = std::operator>>((istream *)&line,(string *)&cm);
      if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::string::_M_replace((ulong)&cm,0,(char *)cm._M_string_length,0x10f22e);
      }
      plVar14 = (long *)std::istream::operator>>((istream *)&line,&p);
      sVar8 = name._M_string_length;
      _Var18 = name._M_dataplus;
      if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) {
        p = -1;
      }
      if (name._M_string_length != 0) {
        sVar21 = 0;
        do {
          iVar12 = toupper((int)_Var18._M_p[sVar21]);
          _Var18._M_p[sVar21] = (char)iVar12;
          sVar21 = sVar21 + 1;
        } while (sVar8 != sVar21);
      }
      Move::Move((Move *)&s,&name,n,s_1,bsize,*cm._M_dataplus._M_p != 'd',0,p,0);
      place_move((Move *)&s,iVar10 == 0);
      if (local_388._M_p != local_378) {
        operator_delete(local_388._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)s._M_dataplus._M_p != &s.field_2) {
        operator_delete(s._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cm._M_dataplus._M_p != paVar1) {
        operator_delete(cm._M_dataplus._M_p);
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)cm._M_dataplus._M_p != paVar1) {
      operator_delete(cm._M_dataplus._M_p);
    }
    _Var18._M_p = name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p == &name.field_2) goto LAB_0010b47e;
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)&command);
    if (iVar10 != 0) {
      iVar10 = std::__cxx11::string::compare((char *)&command);
      if (iVar10 == 0) {
        piVar15 = (istream *)std::istream::operator>>((istream *)&line,(int *)&s);
        plVar14 = (long *)std::istream::operator>>(piVar15,(int *)&name);
        if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) == 0) {
          board[(int)s._M_dataplus._M_p][(int)name._M_dataplus._M_p] = '\0';
          points[(int)s._M_dataplus._M_p][(int)name._M_dataplus._M_p] = 0;
        }
        goto LAB_0010b47e;
      }
      iVar10 = std::__cxx11::string::compare((char *)&command);
      if (iVar10 == 0) {
        s._M_dataplus._M_p = (pointer)&s.field_2;
        s._M_string_length = 0;
        s.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)&line,(string *)&s);
        if (s._M_string_length != 0) {
          pbVar22 = (byte *)(s._M_dataplus._M_p + s._M_string_length);
          paVar1 = &name.field_2;
          _Var18._M_p = s._M_dataplus._M_p;
          do {
            arr_00 = points;
            arr = letter_mult;
            ppiVar4 = word_mult;
            bVar2 = *_Var18._M_p;
            if (bVar2 < 0x70) {
              if (bVar2 == 0x61) {
                ppiVar4 = *adj;
                name._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&name,"adj[0]:","");
                print(ppiVar4,&name,3);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)name._M_dataplus._M_p != paVar1) {
                  operator_delete(name._M_dataplus._M_p);
                }
                ppiVar4 = adj[1];
                name._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&name,"adj[1]:","");
                print(ppiVar4,&name,3);
                goto joined_r0x0010aa5c;
              }
              if (bVar2 != 0x62) {
                if (bVar2 != 0x6c) {
LAB_0010aa6c:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Invalid print command: ",0x17);
                  name._M_dataplus._M_p._0_1_ = bVar2;
                  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,(char *)&name,1);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
                  goto LAB_0010ab56;
                }
                name._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&name,"letter multipliers:","");
                print(arr,&name,1);
                goto joined_r0x0010aa5c;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"board:",6);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              std::ostream::put(-0x58);
              std::ostream::flush();
              print_board();
            }
            else {
              if (bVar2 == 0x70) {
                name._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)&name,"tile values:","");
                print(arr_00,&name,3);
              }
              else {
                if (bVar2 == 0x72) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"rack: ",6);
                  if (0 < rack_size) {
                    lVar20 = 0;
                    do {
                      name._M_dataplus._M_p._0_1_ = rack[lVar20];
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(char *)&name,1);
                      lVar20 = lVar20 + 1;
                    } while (lVar20 < rack_size);
                  }
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                  poVar16 = (ostream *)&std::cout;
LAB_0010ab56:
                  std::ostream::put((char)poVar16);
                  std::ostream::flush();
                  goto LAB_0010ab69;
                }
                if (bVar2 != 0x77) goto LAB_0010aa6c;
                name._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&name,"word multipliers:","");
                print(ppiVar4,&name,1);
              }
joined_r0x0010aa5c:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != paVar1) {
                operator_delete(name._M_dataplus._M_p);
              }
            }
LAB_0010ab69:
            _Var18._M_p = _Var18._M_p + 1;
          } while ((byte *)_Var18._M_p != pbVar22);
        }
        _Var18._M_p = s._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)s._M_dataplus._M_p == &s.field_2) goto LAB_0010b47e;
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)&command);
        if (iVar10 == 0) {
          s._M_string_length = 0;
          s.field_2._M_local_buf[0] = '\0';
          s._M_dataplus._M_p = (pointer)&s.field_2;
          piVar15 = std::operator>>((istream *)&line,(string *)&s);
          _Var18._M_p = s._M_dataplus._M_p;
          if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) == 0) {
            iVar10 = toupper((int)*s._M_dataplus._M_p);
            *_Var18._M_p = (char)iVar10;
            calc_legal(*s._M_dataplus._M_p);
            ppbVar5 = (*legal)[(long)*s._M_dataplus._M_p + -0x41];
            std::operator+(&cm,"legal[0][",&s);
            plVar14 = (long *)std::__cxx11::string::append((char *)&cm);
            paVar1 = &name.field_2;
            psVar17 = (size_type *)(plVar14 + 2);
            if ((size_type *)*plVar14 == psVar17) {
              name.field_2._M_allocated_capacity = *psVar17;
              name.field_2._8_8_ = plVar14[3];
              name._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              name.field_2._M_allocated_capacity = *psVar17;
              name._M_dataplus._M_p = (pointer)*plVar14;
            }
            name._M_string_length = plVar14[1];
            *plVar14 = (long)psVar17;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            print(ppbVar5,&name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != paVar1) {
              operator_delete(name._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)cm._M_dataplus._M_p != &cm.field_2) {
              operator_delete(cm._M_dataplus._M_p);
            }
            ppbVar5 = legal[1][(long)*s._M_dataplus._M_p + -0x41];
            std::operator+(&cm,"legal[1][",&s);
            plVar14 = (long *)std::__cxx11::string::append((char *)&cm);
            psVar17 = (size_type *)(plVar14 + 2);
            if ((size_type *)*plVar14 == psVar17) {
              name.field_2._M_allocated_capacity = *psVar17;
              name.field_2._8_8_ = plVar14[3];
              name._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              name.field_2._M_allocated_capacity = *psVar17;
              name._M_dataplus._M_p = (pointer)*plVar14;
            }
            name._M_string_length = plVar14[1];
            *plVar14 = (long)psVar17;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            print(ppbVar5,&name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != paVar1) {
              operator_delete(name._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)cm._M_dataplus._M_p != &cm.field_2) {
              operator_delete(cm._M_dataplus._M_p);
            }
          }
          _Var18._M_p = s._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)s._M_dataplus._M_p == &s.field_2) goto LAB_0010b47e;
          goto LAB_0010b479;
        }
        iVar10 = std::__cxx11::string::compare((char *)&command);
        if (iVar10 == 0) {
          s._M_string_length = 0;
          s.field_2._M_local_buf[0] = '\0';
          s._M_dataplus._M_p = (pointer)&s.field_2;
          piVar15 = std::operator>>((istream *)&line,(string *)&s);
          sVar8 = s._M_string_length;
          _Var18._M_p = s._M_dataplus._M_p;
          if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) != 0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)s._M_dataplus._M_p == &s.field_2) goto LAB_0010b47e;
            goto LAB_0010b479;
          }
          if (s._M_string_length != 0) {
            sVar21 = 0;
            do {
              pcVar13 = rack;
              pcVar19 = rack + rack_size;
              iVar10 = toupper((int)_Var18._M_p[sVar21]);
              name._M_dataplus._M_p._0_4_ = iVar10;
              pcVar13 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                  (pcVar13,pcVar19,&name);
              if (pcVar13 != rack + rack_size) {
                iVar10 = rand();
                pcVar6 = bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar23 = (ulong)(long)iVar10 %
                         (ulong)((long)bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start);
                cVar3 = *pcVar13;
                *pcVar13 = bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar23];
                pcVar6[uVar23] = cVar3;
              }
              sVar21 = sVar21 + 1;
            } while (sVar8 != sVar21);
          }
          _Var18._M_p = s._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)s._M_dataplus._M_p == &s.field_2) goto LAB_0010b47e;
        }
        else {
          iVar10 = std::__cxx11::string::compare((char *)&command);
          if (iVar10 == 0) {
            if ((abStack_198[*(long *)(_line + -0x18)] & 5) == 0) {
              do {
                s._M_string_length = 0;
                s.field_2._M_local_buf[0] = '\0';
                s._M_dataplus._M_p = (pointer)&s.field_2;
                std::operator>>((istream *)&line,(string *)&s);
                sVar8 = s._M_string_length;
                _Var18._M_p = s._M_dataplus._M_p;
                if (*s._M_dataplus._M_p == '+') {
                  uVar11 = (int)s._M_dataplus._M_p[1] - 0x30;
                  if (uVar11 < 10) {
                    for (; (uVar11 != 0 &&
                           (bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start !=
                            bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish));
                        bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish + -1) {
                      lVar20 = (long)rack_size;
                      rack_size = rack_size + 1;
                      rack[lVar20] = bag.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_finish[-1];
                      uVar11 = uVar11 - 1;
                    }
                  }
                  else if (s._M_string_length != 0) {
                    sVar21 = 0;
                    do {
                      iVar10 = toupper((int)_Var18._M_p[sVar21]);
                      lVar20 = (long)rack_size;
                      rack_size = rack_size + 1;
                      rack[lVar20] = (char)iVar10;
                      sVar21 = sVar21 + 1;
                    } while (sVar8 != sVar21);
                  }
                }
                if ((*s._M_dataplus._M_p == '-') && (1 < s._M_string_length)) {
                  uVar23 = 1;
                  do {
                    pcVar13 = rack;
                    pcVar19 = rack + rack_size;
                    iVar10 = toupper((int)s._M_dataplus._M_p[uVar23]);
                    name._M_dataplus._M_p._0_4_ = iVar10;
                    pcVar13 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                        (pcVar13,pcVar19,&name);
                    lVar20 = (long)rack_size;
                    if (pcVar13 != rack + lVar20) {
                      rack_size = rack_size + -1;
                      __n = (long)(rack + lVar20) - (long)(pcVar13 + 1);
                      if (__n != 0) {
                        memmove(pcVar13,pcVar13 + 1,__n);
                      }
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar23 < s._M_string_length);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)s._M_dataplus._M_p != &s.field_2) {
                  operator_delete(s._M_dataplus._M_p);
                }
              } while ((abStack_198[*(long *)(_line + -0x18)] & 5) == 0);
            }
            if (suppress) goto LAB_0010b47e;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rack: ",6);
            if (0 < rack_size) {
              lVar20 = 0;
              do {
                s._M_dataplus._M_p._0_1_ = rack[lVar20];
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)&s,1);
                lVar20 = lVar20 + 1;
              } while (lVar20 < rack_size);
            }
LAB_0010b02f:
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            goto LAB_0010b47e;
          }
          iVar10 = std::__cxx11::string::compare((char *)&command);
          if (iVar10 == 0) {
            name._M_string_length = 0;
            name.field_2._M_allocated_capacity =
                 name.field_2._M_allocated_capacity & 0xffffffffffffff00;
            n = 999999;
            s_1 = 0;
            bVar24 = false;
            name._M_dataplus._M_p = (pointer)&name.field_2;
            while (piVar15 = std::operator>>((istream *)&line,(string *)&name),
                  ((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) == 0) {
              if (*name._M_dataplus._M_p == '-') {
                std::__cxx11::stringstream::stringstream((stringstream *)&s);
                if (2 < name._M_string_length) {
                  std::__cxx11::string::substr((ulong)&cm,(ulong)&name);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)s.field_2._M_local_buf,cm._M_dataplus._M_p,
                             cm._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)cm._M_dataplus._M_p != &cm.field_2) {
                    operator_delete(cm._M_dataplus._M_p);
                  }
                }
                cVar3 = name._M_dataplus._M_p[1];
                if (cVar3 == 'h') {
                  bVar24 = true;
                }
                else if (cVar3 == 'n') {
                  plVar14 = (long *)std::istream::operator>>((istream *)&s,&n);
                  if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) {
                    n = 999999;
                  }
                }
                else if ((cVar3 == 's') &&
                        (plVar14 = (long *)std::istream::operator>>((istream *)&s,&s_1),
                        (*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0)) {
                  s_1 = 0;
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)&s);
                std::ios_base::~ios_base(local_348);
              }
            }
            find_moves();
            sort_moves(bVar24);
            pMVar7 = moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            m_00 = moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                   super__Vector_impl_data._M_start;
            lVar20 = std::cout;
            while (((std::cout = lVar20, m_00 != pMVar7 && (s_1 <= m_00->score)) &&
                   (bVar24 = n != 0, n = n + -1, bVar24))) {
              *(undefined8 *)(std::operator>> + *(long *)(lVar20 + -0x18)) = 0xb;
              lVar20 = *(long *)(lVar20 + -0x18);
              if ((&DAT_002ca289)[lVar20] == '\0') {
                cVar9 = (code)std::ios::widen((char)lVar20 + -0x58);
                _ITM_registerTMCloneTable[lVar20] = cVar9;
                (&DAT_002ca289)[lVar20] = 1;
              }
              _ITM_registerTMCloneTable[lVar20] = (code)0x20;
              operator<<((ostream *)&std::cout,m_00);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              m_00 = m_00 + 1;
              lVar20 = std::cout;
            }
            _Var18._M_p = name._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p == &name.field_2) goto LAB_0010b47e;
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)&command);
            if (iVar10 == 0) {
              std::istream::_M_extract<bool>((bool *)&line);
              goto LAB_0010b47e;
            }
            iVar10 = std::__cxx11::string::compare((char *)&command);
            if (iVar10 != 0) {
              iVar10 = std::__cxx11::string::compare((char *)&command);
              if (iVar10 == 0) {
                s._M_string_length = 0;
                s.field_2._M_local_buf[0] = '\0';
                s._M_dataplus._M_p = (pointer)&s.field_2;
                piVar15 = std::operator>>((istream *)&line,(string *)&s);
                sVar8 = s._M_string_length;
                _Var18._M_p = s._M_dataplus._M_p;
                if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) == 0) {
                  if (s._M_string_length != 0) {
                    sVar21 = 0;
                    do {
                      iVar10 = toupper((int)_Var18._M_p[sVar21]);
                      _Var18._M_p[sVar21] = (char)iVar10;
                      sVar21 = sVar21 + 1;
                    } while (sVar8 != sVar21);
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&words_abi_cxx11_._M_h,&s);
                  poVar16 = std::ostream::_M_insert<bool>(true);
                  std::endl<char,std::char_traits<char>>(poVar16);
                }
                _Var18._M_p = s._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)s._M_dataplus._M_p == &s.field_2) goto LAB_0010b47e;
              }
              else {
                iVar10 = std::__cxx11::string::compare((char *)&command);
                if (iVar10 == 0) {
                  clear();
                  goto LAB_0010b47e;
                }
                iVar10 = std::__cxx11::string::compare((char *)&command);
                if (iVar10 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Invalid command, try again.",0x1b);
                  goto LAB_0010b02f;
                }
                s._M_string_length = 0;
                s.field_2._M_local_buf[0] = '\0';
                s._M_dataplus._M_p = (pointer)&s.field_2;
                std::operator>>((istream *)&line,(string *)&s);
                sVar8 = s._M_string_length;
                _Var18._M_p = s._M_dataplus._M_p;
                if (s._M_string_length == 0) {
                  iVar10 = 0;
                }
                else {
                  sVar21 = 0;
                  iVar10 = 0;
                  do {
                    iVar12 = toupper((int)_Var18._M_p[sVar21]);
                    iVar10 = ((iVar12 + iVar10) * 0x1b + -0x6c0) % 0xdaf26b;
                    sVar21 = sVar21 + 1;
                  } while (sVar8 != sVar21);
                  iVar10 = iVar10 / 0x1b;
                }
                poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,":",1);
                poVar16 = std::ostream::_M_insert<bool>(SUB81(poVar16,0));
                std::endl<char,std::char_traits<char>>(poVar16);
                _Var18 = s._M_dataplus;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)s._M_dataplus._M_p == &s.field_2) goto LAB_0010b47e;
              }
              goto LAB_0010b479;
            }
            name._M_string_length = 0;
            name.field_2._M_allocated_capacity =
                 name.field_2._M_allocated_capacity & 0xffffffffffffff00;
            name._M_dataplus._M_p = (pointer)&name.field_2;
            piVar15 = std::operator>>((istream *)&line,(string *)&name);
            if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) == 0) {
              std::fstream::fstream(&s,(string *)&name,_S_out|_S_in);
              if ((abStack_3a8[*(long *)(s._M_dataplus._M_p + -0x18)] & 5) != 0) {
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,name._M_dataplus._M_p,
                                     name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," not found",10);
                std::endl<char,std::char_traits<char>>(poVar16);
              }
              if ((abStack_3a8[*(long *)(s._M_dataplus._M_p + -0x18)] & 5) == 0) {
                do {
                  cm._M_string_length = 0;
                  cm.field_2._M_local_buf[0] = '\0';
                  cm._M_dataplus._M_p = (pointer)&cm.field_2;
                  std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&s,(string *)&cm);
                  do_command(&cm,suppress);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)cm._M_dataplus._M_p != &cm.field_2) {
                    operator_delete(cm._M_dataplus._M_p);
                  }
                } while ((abStack_3a8[*(long *)(s._M_dataplus._M_p + -0x18)] & 5) == 0);
              }
              std::fstream::~fstream(&s);
            }
            _Var18._M_p = name._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p == &name.field_2) goto LAB_0010b47e;
          }
        }
      }
      operator_delete(_Var18._M_p);
      goto LAB_0010b47e;
    }
    name._M_string_length = 0;
    name.field_2._M_allocated_capacity = name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    paVar1 = &cm.field_2;
    cm._M_string_length = 0;
    cm.field_2._M_local_buf[0] = '\0';
    name._M_dataplus._M_p = (pointer)&name.field_2;
    cm._M_dataplus._M_p = (pointer)paVar1;
    piVar15 = std::operator>>((istream *)&line,(string *)&name);
    if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) == 0) {
      plVar14 = (long *)std::istream::operator>>((istream *)&line,&n);
      if (((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) ||
         (plVar14 = (long *)std::istream::operator>>((istream *)&line,&s_1),
         (*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0)) {
        n = (bsize - (bsize + 1 >> 0x1f)) + 1 >> 1;
        s_1 = n;
      }
      piVar15 = std::operator>>((istream *)&line,(string *)&cm);
      if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::string::operator=((string *)&cm,"a");
      }
      plVar14 = (long *)std::istream::operator>>((istream *)&line,&p);
      sVar8 = name._M_string_length;
      _Var18 = name._M_dataplus;
      if ((*(byte *)((long)plVar14 + *(long *)(*plVar14 + -0x18) + 0x20) & 5) != 0) {
        p = -1;
      }
      if (name._M_string_length != 0) {
        sVar21 = 0;
        do {
          iVar10 = toupper((int)_Var18._M_p[sVar21]);
          _Var18._M_p[sVar21] = (char)iVar10;
          sVar21 = sVar21 + 1;
        } while (sVar8 != sVar21);
      }
      Move::Move((Move *)&s,&name,n,s_1,bsize,*cm._M_dataplus._M_p != 'd',0,p,0);
      is_legal((Move *)&s);
      operator<<((ostream *)&std::cout,(Move *)&s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," legal: ",8);
      poVar16 = std::ostream::_M_insert<bool>(true);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      if (local_388._M_p != local_378) {
        operator_delete(local_388._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)s._M_dataplus._M_p != &s.field_2) {
        operator_delete(s._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cm._M_dataplus._M_p != paVar1) {
        operator_delete(cm._M_dataplus._M_p);
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)cm._M_dataplus._M_p != paVar1) {
      operator_delete(cm._M_dataplus._M_p);
    }
    _Var18._M_p = name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p == &name.field_2) goto LAB_0010b47e;
  }
LAB_0010b479:
  operator_delete(_Var18._M_p);
LAB_0010b47e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)command._M_dataplus._M_p != &command.field_2) {
    operator_delete(command._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&line);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void do_command(string &cmd_string, bool suppress) {
    stringstream line(cmd_string);
    string command;
    line >> command;
    if (command == "game") {
        game_loop();
    } else if (command == "pb") { // play best move (according to bot)
        find_moves();
        if (moves.empty()) {
            if (!suppress) cout << "No moves" << endl;
            return;
        }
        sort_moves();
        Move &mm = moves.front();
        place_move(mm);
        if (!suppress) {
            print_board();
            cout << mm << endl;
        }
        //do_command("ra -"+mm.word,suppress);
    } else if (command == "pm") { // Play move
        bool override = false;
        int i, j, p;
        string ss, acr;
        if (!(line >> ss)) return;
        if (ss == "-f") {
            override = true;
            if (!(line >> ss)) return;
        }
        if (!(line >> i) || !(line >> j)) i = j = (bsize + 1) / 2;
        if (!(line >> acr)) acr = "a";
        if (!(line >> p)) p = -1;

        for (char &c:ss) c = toupper(c);
        place_move(Move(ss, i, j, bsize, acr[0] != 'd', 0, p), override);
    } else if (command == "il") { // List legal moves
        int i, j, p;
        string ss, acr;
        if (!(line >> ss)) return;
        if (!(line >> i) || !(line >> j)) i = j = (bsize + 1) / 2;
        if (!(line >> acr)) acr = "a";
        if (!(line >> p)) p = -1;

        for (char &c:ss) c = toupper(c);
        Move m(ss, i, j, bsize, acr[0] != 'd', 0, p);
        bool leg = is_legal(m);
        cout << m << " legal: " << leg << endl;
    } else if (command == "rm") { // remove a tile from the board
        int i, j;
        if (!(line >> i >> j)) return;
        board[i][j] = 0;
        points[i][j] = 0;
    } else if (command == "pr") {
        string ss;
        line >> ss;
        for (char cc:ss) {
            switch (cc) {
                case 'b': // print the board
                    cout << "board:" << endl;
                    print_board();
                    break;
                case 'a': // prints the scores of adjacent words
                    print(adj[0], "adj[0]:", 3);
                    print(adj[1], "adj[1]:", 3);
                    break;
                case 'r': // print my rack
                    cout << "rack: ";
                    for (int i = 0; i < rack_size; i++) cout << rack[i];
                    cout << endl;
                    break;
                case 'l': // print letter bonus squares
                    print(letter_mult, "letter multipliers:");
                    break;
                case 'w': // print word bonus squares
                    print(word_mult, "word multipliers:");
                    break;
                case 'p': // print tile values
                    print(points, "tile values:", 3);
                    break;
                default:
                    cout << "Invalid print command: " << cc << endl;
                    break;
            }
        }
    } else if (command == "cl") {
        string ss;
        if (!(line >> ss)) return;
        ss[0] = toupper(ss[0]);
        calc_legal(ss[0]);
        print(legal[0][ss[0] - 'A'], "legal[0][" + ss + "]");
        print(legal[1][ss[0] - 'A'], "legal[1][" + ss + "]");
    } else if (command == "swap") {
        string ss;
        if (!(line >> ss)) return;
        for (char &c:ss) {
            char *pos = find(rack, rack + rack_size, toupper(c));
            if (pos != rack + rack_size) {
                std::swap(rack[pos - rack], bag[rand() % bag.size()]);
            }
        }
    } else if (command == "ra") {
        while (line) {
            string ss;
            line >> ss;
            if (ss[0] == '+') {
                if (isdigit(ss[1]))
                    for (int i = ss[1] - '0'; i-- && !bag.empty();) {
                        rack[rack_size++] = bag.back();
                        bag.pop_back();
                    }
                else
                    for (char &c:ss)
                        rack[rack_size++] = toupper(c);
            }
            if (ss[0] == '-') {
                for (int i = 1; i < ss.size(); i++) {
                    char *pos = find(rack, rack + rack_size, toupper(ss[i]));
                    if (pos != rack + rack_size)
                        std::move(pos + 1, rack + rack_size--, pos);
                }
            }
        }
        if (suppress) return;
        cout << "rack: ";
        for (int i = 0; i < rack_size; i++) cout << rack[i];
        cout << endl;
    } else if (command == "lm") {
        string st;
        int n = 999999, s = 0;
        bool use_heuristics = false;
        while (line >> st) {
            if (st[0] != '-') continue;
            stringstream ss;
            if (st.length() >= 3) ss << st.substr(3);
            switch (st[1]) {
                case 'n':
                    if (!(ss >> n)) n = 999999;
                    break;
                case 's':
                    if (!(ss >> s)) s = 0;
                    break;
                case 'h':
                    use_heuristics = true;
                    break;
            }
        }
        find_moves();
        sort_moves(use_heuristics);
        for (Move &m:moves) {
            if (m.score < s || n-- == 0) break;
            cout << setw(11) << setfill(' ') << m << endl;
        }
    } else if (command == "db") {
        line >> debug;
    } else if (command == "file") {
        string name;
        if (!(line >> name)) return;
        fstream fs{name};
        if (!fs) cout << name << " not found" << endl;
        while (fs) {
            string cm;
            getline(fs, cm);
            do_command(cm, suppress);
        }
    } else if (command == "word") {
        string w;
        if (!(line >> w)) return;
        for (char &c:w) c = toupper(int(c));
        cout << is_word(w) << endl;
    } else if (command == "clear") {
        clear();
    } else if (command == "ip") {
        string s;
        line >> s;
        int r_hash = 0;
        for (char c:s) {
            r_hash = ((r_hash + toupper(c) - 'A' + 1) * 27) % MOD;
        }
        cout << r_hash / 27 << ":" << chains[r_hash / 27] << endl;
    } else {
        cout << "Invalid command, try again." << endl;
    }
}